

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::ParseDisambiguator
          (RustSymbolParser *this,int *value)

{
  bool bVar1;
  int local_34;
  int local_24;
  int *piStack_20;
  int base_62_value;
  int *value_local;
  RustSymbolParser *this_local;
  
  *value = -1;
  piStack_20 = value;
  value_local = (int *)this;
  bVar1 = Eat(this,'s');
  if (bVar1) {
    local_24 = 0;
    bVar1 = ParseBase62Number(this,&local_24);
    if (bVar1) {
      if (local_24 < 0) {
        local_34 = -1;
      }
      else {
        local_34 = local_24 + 1;
      }
      *piStack_20 = local_34;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    *piStack_20 = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseDisambiguator(int& value) {
    value = -1;

    // disambiguator = s base-62-number
    //
    // Disambiguators are optional.  An omitted disambiguator is zero.
    if (!Eat('s')) {
      value = 0;
      return true;
    }
    int base_62_value = 0;
    if (!ParseBase62Number(base_62_value)) return false;
    value = base_62_value < 0 ? -1 : base_62_value + 1;
    return true;
  }